

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_logout(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  tclpkcs11_handle *handle;
  int iVar1;
  long in_RAX;
  long lVar2;
  Tcl_Obj *pTVar3;
  CK_RV errorCode;
  char *pcVar4;
  ProcErrorProc *pPVar5;
  long slotid_long;
  
  if (cd == (ClientData)0x0) {
    pPVar5 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "invalid clientdata";
  }
  else if (objc == 3) {
    pTVar3 = objv[2];
    slotid_long = in_RAX;
    lVar2 = (**(code **)((long)cd + 0x40))(cd,objv[1]);
    if ((lVar2 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar2 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar1 = (*tclStubsPtr->tcl_GetLongFromObj)((Tcl_Interp_conflict *)interp,pTVar3,&slotid_long);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = tclpkcs11_start_session(handle,slotid_long);
      if (iVar1 == 0) {
        errorCode = (*handle->pkcs11->C_Logout)(handle->session);
        if (errorCode == 0) {
LAB_00103ad8:
          pPVar5 = tclStubsPtr->tcl_SetObjResult;
          pTVar3 = (*tclStubsPtr->tcl_NewIntObj)(1);
          (*pPVar5)((Tcl_Interp_conflict *)interp,pTVar3);
          return 0;
        }
        if (errorCode == 0x32) {
          handle->session_active = 0;
          (*handle->pkcs11->C_CloseSession)(handle->session);
          goto LAB_00103ad8;
        }
        pPVar5 = tclStubsPtr->tcl_SetObjResult;
      }
      else {
        errorCode = (CK_RV)iVar1;
        pPVar5 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar3 = tclpkcs11_pkcs11_error(errorCode);
      goto LAB_00103a97;
    }
    pPVar5 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "invalid handle";
  }
  else {
    pPVar5 = tclStubsPtr->tcl_SetObjResult;
    pcVar4 = "wrong # args: should be \"pki::pkcs11::login handle slot\"";
  }
  pTVar3 = (*tclStubsPtr->tcl_NewStringObj)(pcVar4,-1);
LAB_00103a97:
  (*pPVar5)((Tcl_Interp_conflict *)interp,pTVar3);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_logout(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_Obj *tcl_handle, *tcl_slotid;
  long slotid_long;
  int tcl_rv;

  CK_SLOT_ID slotid;
  CK_RV chk_rv;

  if (!cd) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid clientdata", -1));

    return(TCL_ERROR);
  }

  if (objc != 3) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("wrong # args: should be \"pki::pkcs11::login handle slot\"", -1));

    return(TCL_ERROR);
  }

  tcl_handle = objv[1];
  tcl_slotid = objv[2];

  interpdata = (struct tclpkcs11_interpdata *) cd;

  tcl_handle_entry = Tcl_FindHashEntry(&interpdata->handles, (const char *) tcl_handle);
  if (!tcl_handle_entry) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);
  if (!handle) {
    Tcl_SetObjResult(interp, Tcl_NewStringObj("invalid handle", -1));

    return(TCL_ERROR);
  }

  tcl_rv = Tcl_GetLongFromObj(interp, tcl_slotid, &slotid_long);
  if (tcl_rv != TCL_OK) {
    return(tcl_rv);
  }

  slotid = slotid_long;

  chk_rv = tclpkcs11_start_session(handle, slotid);
  if (chk_rv != CKR_OK) {
    Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

    return(TCL_ERROR);
  }

  chk_rv = handle->pkcs11->C_Logout(handle->session);
  if (chk_rv != CKR_OK) {
    if (chk_rv == CKR_DEVICE_REMOVED) {
      handle->session_active = 0;

      handle->pkcs11->C_CloseSession(handle->session);
    } else {
      Tcl_SetObjResult(interp, tclpkcs11_pkcs11_error(chk_rv));

      return(TCL_ERROR);
    }
  }

  Tcl_SetObjResult(interp, Tcl_NewBooleanObj(1));

  return(TCL_OK);
}